

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

size_t __thiscall
backward::StackTraceImpl<backward::system_tag::linux_tag>::load_here
          (StackTraceImpl<backward::system_tag::linux_tag> *this,size_t depth,void *context,
          void *error_addr)

{
  StackTraceImplHolder *this_00;
  void *in_RCX;
  vector<void_*,_std::allocator<void_*>_> *in_RDX;
  long in_RSI;
  StackTraceImplBase *in_RDI;
  size_t trace_cnt;
  callback in_stack_ffffffffffffffc8;
  callback in_stack_ffffffffffffffd0;
  size_t local_8;
  
  StackTraceImplBase::load_thread_info(in_RDI);
  StackTraceImplBase::set_context(in_RDI,in_RDX);
  StackTraceImplBase::set_error_addr(in_RDI,in_RCX);
  if (in_RSI == 0) {
    local_8 = 0;
  }
  else {
    std::vector<void_*,_std::allocator<void_*>_>::resize(in_RDX,(size_type)in_RCX);
    callback::callback((callback *)&stack0xffffffffffffffc8,
                       (StackTraceImpl<backward::system_tag::linux_tag> *)in_RDI);
    this_00 = (StackTraceImplHolder *)
              details::unwind<backward::StackTraceImpl<backward::system_tag::linux_tag>::callback>
                        (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8.self);
    std::vector<void_*,_std::allocator<void_*>_>::resize(in_RDX,(size_type)in_RCX);
    StackTraceImplBase::skip_n_firsts(in_RDI,0);
    local_8 = StackTraceImplHolder::size(this_00);
  }
  return local_8;
}

Assistant:

NOINLINE
  size_t load_here(size_t depth = 32, void *context = nullptr,
                   void *error_addr = nullptr) {
    load_thread_info();
    set_context(context);
    set_error_addr(error_addr);
    if (depth == 0) {
      return 0;
    }
    _stacktrace.resize(depth);
    size_t trace_cnt = details::unwind(callback(*this), depth);
    _stacktrace.resize(trace_cnt);
    skip_n_firsts(0);
    return size();
  }